

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::SortHelper<StringItem>(Var array,CompareVarsInfo *cvInfo)

{
  Type TVar1;
  ScriptContext *scriptContext;
  code *pcVar2;
  undefined4 uVar3;
  bool bVar4;
  BOOL BVar5;
  Var pvVar6;
  TempArenaAllocatorObject *tempAllocator;
  StringItem *list;
  RecyclableObject *this;
  JavascriptArray *pJVar7;
  int iVar8;
  ulong uVar9;
  uint32 index;
  uint32 length;
  int iVar10;
  Var local_78;
  Var item;
  undefined4 *local_68;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  RecyclableObject *local_38;
  RecyclableObject *obj;
  
  scriptContext = cvInfo->scriptContext;
  local_60 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,array);
  local_38 = (RecyclableObject *)0x0;
  BVar5 = JavascriptConversion::ToObject(array,scriptContext,&local_38);
  if (BVar5 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec42,L"Array.prototype.sort");
  }
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  pvVar6 = JavascriptOperators::OP_GetLength(local_38,scriptContext);
  jsReentLock._24_4_ = JavascriptConversion::ToUInt32(pvVar6,scriptContext);
  JsReentLock::MutateArrayObject((JsReentLock *)local_60);
  *(bool *)((long)local_60 + 0x108) = true;
  if (jsReentLock._24_4_ != 0) {
    item = scriptContext;
    tempAllocator = ScriptContext::GetTemporaryAllocator(scriptContext,L"Runtime");
    length = 0;
    list = Memory::AllocateArray<Memory::ArenaAllocator,StringItem,false>
                     ((Memory *)&tempAllocator->allocator,
                      (ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (ulong)(uint)jsReentLock._24_4_);
    local_68 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    iVar8 = 0;
    jsReentLock._28_4_ = 0;
    for (index = 0; jsReentLock._24_4_ != index; index = index + 1) {
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BVar5 = JavascriptOperators::HasItem(local_38,index);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
      if (BVar5 == 0) {
LAB_00a5e04c:
        jsReentLock._28_4_ = jsReentLock._28_4_ + 1;
      }
      else {
        local_78 = (Var)0x0;
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar5 = JavascriptOperators::GetItem(local_38,index,&local_78,(ScriptContext *)item);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        pvVar6 = local_78;
        *(bool *)((long)local_60 + 0x108) = true;
        if (BVar5 == 0) goto LAB_00a5e04c;
        if (local_78 == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_68 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_00a5e267;
          *local_68 = 0;
        }
        bVar4 = TaggedInt::Is(pvVar6);
        if ((ulong)pvVar6 >> 0x32 != 0 || bVar4) {
LAB_00a5e0a1:
          SortSetHelper(list,local_78,length,(JsReentLock *)local_60,(ScriptContext *)item);
          length = length + 1;
        }
        else {
          this = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
          if (this == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *local_68 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar4) goto LAB_00a5e267;
            *local_68 = 0;
          }
          TVar1 = ((this->type).ptr)->typeId;
          if (0x57 < (int)TVar1) {
            BVar5 = RecyclableObject::IsExternal(this);
            if (BVar5 == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_68 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                          "GetTypeId aValue has invalid TypeId");
              if (!bVar4) {
LAB_00a5e267:
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *local_68 = 0;
            }
            goto LAB_00a5e0a1;
          }
          if (TVar1 != TypeIds_Undefined) goto LAB_00a5e0a1;
          iVar8 = iVar8 + 1;
        }
      }
    }
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    if (length < 0x200) {
      InsertionSort<StringItem>(list,length,cvInfo);
    }
    else {
      MergeSort<StringItem>(list,length,cvInfo,&tempAllocator->allocator);
    }
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
    iVar8 = -iVar8;
    for (uVar9 = 0; uVar3 = jsReentLock._28_4_, pvVar6 = item, length != uVar9; uVar9 = uVar9 + 1) {
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      JavascriptOperators::SetItem
                (local_38,local_38,(uint32)uVar9,(list->Value).ptr,(ScriptContext *)item,
                 PropertyOperation_ThrowIfNonWritable|PropertyOperation_ThrowIfNotExtensible,0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
      iVar8 = iVar8 + -1;
      list = list + 1;
    }
    for (; -iVar8 != length; length = length + 1) {
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      JavascriptOperators::SetItem
                (local_38,local_38,length,*(Var *)(*(long *)((long)pvVar6 + 8) + 0x430),
                 (ScriptContext *)pvVar6,
                 PropertyOperation_ThrowIfNonWritable|PropertyOperation_ThrowIfNotExtensible,0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
    }
    for (iVar10 = 0; uVar3 != iVar10; iVar10 = iVar10 + 1) {
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      JavascriptOperators::DeleteItem
                (local_38,-iVar8 + iVar10,PropertyOperation_ThrowOnDeleteIfNotConfig);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
    }
    ScriptContext::ReleaseTemporaryAllocator((ScriptContext *)pvVar6,tempAllocator);
    bVar4 = DynamicObject::IsAnyArray(local_38);
    if (bVar4) {
      pJVar7 = UnsafeVarTo<Js::JavascriptArray,Js::RecyclableObject>(local_38);
      ClearSegmentMap(pJVar7);
      pJVar7 = UnsafeVarTo<Js::JavascriptArray,Js::RecyclableObject>(local_38);
      (*(pJVar7->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])
                (pJVar7);
    }
  }
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_38;
}

Assistant:

Var JavascriptArray::SortHelper(Var array, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        ScriptContext* scriptContext = cvInfo->scriptContext;
        
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, array);

        // Per spec, throw if the 'this' value is not a valid object
        RecyclableObject* obj = nullptr;
        if (FALSE == JavascriptConversion::ToObject(array, scriptContext, &obj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.sort"));
        }

        // Get the Length
        JS_REENTRANT(jsReentLock,
            uint32 len = JavascriptConversion::ToUInt32(JavascriptOperators::OP_GetLength(obj, scriptContext), scriptContext));

        // Early return if length = 0
        // Note cannot return early for length = 1 without further checks
        // As per spec we must use HasItem() and GetItem() on each element
        if (len == 0)
        {
            return obj;
        }

        BEGIN_TEMP_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"))
        {
            // Spec mandates that we copy the array into a 'list' before sorting
            // This severely limits the potential for sort side-effects to alter the result
            T* list = AnewArray(tempAlloc, T, len);

            uint32 values = 0;
            uint32 undefinedValues = 0;
            uint32 holes = 0;
            uint32 i = 0, j = 0;

            for (; i < len; ++i)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, i));
                
                if (hasItem)
                {
                    Var item = nullptr;
                    JS_REENTRANT(jsReentLock, BOOL gotItem = JavascriptOperators::GetItem(obj, i, &item, scriptContext));
                    if (gotItem)
                    {
                        TypeId type = JavascriptOperators::GetTypeId(item);
                        if (type != TypeIds_Undefined)
                        {
                            // If T = Var this adds item to the list
                            // If T = StringItem this creates a StringItem from the Var and adds that to the list
                            SortSetHelper(list, item, values, &jsReentLock, scriptContext);
                            values++;
                        }
                        else
                        {
                            ++undefinedValues;
                        }
                    }
                    else
                    {
                        ++holes;
                    }
                }
                else
                {
                    ++holes;
                }
            }

            // Call the appropriate Sorting Algorithm
            // Insertion sort uses less memory and is quicker on short arrays but gets less efficient as arrays get longer
            if (values < 512)
            {
                JS_REENTRANT(jsReentLock, JavascriptArray::InsertionSort<T>(list, values, cvInfo));
            }
            else
            {
                JS_REENTRANT(jsReentLock, JavascriptArray::MergeSort<T>(list, values, cvInfo, tempAlloc));
            }

            // Write the sorted data back to the original array
            // Undefined values and holes are placed at the end
            for (i = 0; i < values; ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::SetItem(obj, obj, i, SortGetHelper(list, i), scriptContext, static_cast<PropertyOperationFlags>(PropertyOperation_ThrowIfNonWritable | PropertyOperation_ThrowIfNotExtensible)));
            }
            for (; j < undefinedValues; ++j, ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::SetItem(obj, obj, i, scriptContext->GetLibrary()->GetUndefined(), scriptContext, static_cast<PropertyOperationFlags>(PropertyOperation_ThrowIfNonWritable | PropertyOperation_ThrowIfNotExtensible)));
            }
            for (j = 0; j < holes; ++j, ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::DeleteItem(obj, i, PropertyOperation_ThrowOnDeleteIfNotConfig));
            }
        }
        END_TEMP_ALLOCATOR(tempAlloc, scriptContext);

        // if the Array is not just an array-like object but an actual array we clear the Segment map
        // optimised access CC generates for arrays that may have been mangled by sorting
        if (VarIs<JavascriptArray>(obj))
        {
            UnsafeVarTo<JavascriptArray>(obj)->ClearSegmentMap();
            #ifdef VALIDATE_ARRAY
            UnsafeVarTo<JavascriptArray>(obj)->ValidateArray();
            #endif
        }

        return obj;
    }